

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O2

ZCC_Expression * __thiscall
ZCCCompiler::ApplyConversion(ZCCCompiler *this,ZCC_Expression *expr,Conversion **route,int routelen)

{
  ulong uVar1;
  ZCC_AST *type;
  ZCCCompiler *this_00;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)routelen;
  type = (ZCC_AST *)expr;
  this_00 = this;
  if (routelen < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    if (expr->Operation == PEX_ConstValue) {
      type = this->AST;
      this_00 = (ZCCCompiler *)expr;
      (*route[uVar2]->ConvertConstant)((ZCC_ExprConstant *)expr,&type->Strings);
    }
    else {
      AddCastNode(this_00,(PType *)type,expr);
    }
  }
  return expr;
}

Assistant:

ZCC_Expression *ZCCCompiler::ApplyConversion(ZCC_Expression *expr, const PType::Conversion **route, int routelen)
{
	for (int i = 0; i < routelen; ++i)
	{
		if (expr->Operation != PEX_ConstValue)
		{
			expr = AddCastNode(route[i]->TargetType, expr);
		}
		else
		{
			route[i]->ConvertConstant(static_cast<ZCC_ExprConstant *>(expr), AST.Strings);
		}
	}
	return expr;
}